

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundingBox.h
# Opt level: O0

void __thiscall vera::BoundingBox::square(BoundingBox *this)

{
  undefined8 uVar1;
  int iVar2;
  int y;
  int iVar3;
  vec3 vVar4;
  vec<3,_float,_(glm::qualifier)0> vVar5;
  undefined8 local_b0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_a8;
  undefined8 local_90;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_88;
  undefined8 uStack_70;
  float mmax;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_68;
  vec<3,_float,_(glm::qualifier)0> local_60;
  vec<3,_float,_(glm::qualifier)0> local_50;
  undefined8 local_40;
  vec3 diag;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_2c;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_28;
  undefined1 local_20 [8];
  vec3 center;
  BoundingBox *this_local;
  
  unique0x10000152 = this;
  vVar4 = getCenter(this);
  local_28 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar4.field_2;
  center.field_0 = local_28;
  stack0xffffffffffffffd0 = vVar4._0_8_;
  local_20._0_4_ = diag.field_2;
  local_20._4_4_ = aStack_2c;
  unique0x10000146 = vVar4;
  vVar4 = getDiagonal(this);
  local_60.field_2 = vVar4.field_2;
  local_50.field_2 = local_60.field_2;
  local_60._0_8_ = vVar4._0_8_;
  local_50.field_0 = local_60.field_0;
  local_50.field_1 = local_60.field_1;
  vVar5 = glm::operator*(&local_50,0.5);
  local_68 = vVar5.field_2;
  diag.field_0.x = local_68.z;
  uStack_70 = vVar5._0_8_;
  local_40 = uStack_70;
  uVar1 = local_40;
  local_40._0_4_ = vVar5.field_0;
  iVar2 = (int)local_40._0_4_;
  if (iVar2 < 1) {
    iVar2 = -iVar2;
  }
  local_40._4_4_ = vVar5.field_1;
  iVar3 = (int)local_40._4_4_;
  if (iVar3 < 1) {
    iVar3 = -iVar3;
  }
  y = (int)local_68.z;
  if (y < 1) {
    y = -y;
  }
  local_40 = uVar1;
  iVar3 = glm::max<int>(iVar3,y);
  iVar2 = glm::max<int>(iVar2,iVar3);
  vVar5 = glm::operator+((vec<3,_float,_(glm::qualifier)0> *)local_20,(float)iVar2);
  local_88 = vVar5.field_2;
  local_90 = vVar5._0_8_;
  (this->max).field_2 = local_88;
  (this->max).field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(undefined4)local_90;
  (this->max).field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_90._4_4_;
  vVar5 = glm::operator-((vec<3,_float,_(glm::qualifier)0> *)local_20,(float)iVar2);
  local_b0 = vVar5._0_8_;
  local_a8 = vVar5.field_2;
  (this->min).field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(undefined4)local_b0;
  (this->min).field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_b0._4_4_;
  (this->min).field_2 = local_a8;
  return;
}

Assistant:

void        square() {
        glm::vec3   center  = getCenter();
        glm::vec3   diag    = getDiagonal() * 0.5f;
        float       mmax    = glm::max( abs(diag.x), glm::max( abs(diag.y), abs(diag.z) ) );
        max                 = center + mmax;
        min                 = center - mmax;
    }